

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# having_binder.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::HavingBinder::QualifyColumnName
          (HavingBinder *this,ColumnRefExpression *colref,ErrorData *error)

{
  bool bVar1;
  ParsedExpression *in_RAX;
  type expr;
  idx_t iVar2;
  pointer *__ptr;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  qualified_colref;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_28;
  
  local_28._M_head_impl = in_RAX;
  ExpressionBinder::QualifyColumnName((ExpressionBinder *)&stack0xffffffffffffffd8,colref,error);
  if (local_28._M_head_impl == (ParsedExpression *)0x0) {
LAB_00729f47:
    (this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)0x0
    ;
  }
  else {
    expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&stack0xffffffffffffffd8);
    iVar2 = BaseSelectBinder::TryBindGroup((BaseSelectBinder *)colref,expr);
    if (iVar2 == 0xffffffffffffffff) {
      bVar1 = ColumnAliasBinder::QualifyColumnAlias
                        ((ColumnAliasBinder *)
                         &colref[1].super_ParsedExpression.super_BaseExpression.query_location,
                         (ColumnRefExpression *)error);
      if (bVar1) goto LAB_00729f47;
    }
    (this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder =
         (_func_int **)local_28._M_head_impl;
    local_28._M_head_impl = (ParsedExpression *)0x0;
  }
  if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_28._M_head_impl !=
      (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
    (*((local_28._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> HavingBinder::QualifyColumnName(ColumnRefExpression &colref, ErrorData &error) {
	auto qualified_colref = ExpressionBinder::QualifyColumnName(colref, error);
	if (!qualified_colref) {
		return nullptr;
	}

	auto group_index = TryBindGroup(*qualified_colref);
	if (group_index != DConstants::INVALID_INDEX) {
		return qualified_colref;
	}
	if (column_alias_binder.QualifyColumnAlias(colref)) {
		return nullptr;
	}
	return qualified_colref;
}